

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

uchar * rsa_pkcs1_signature_string(size_t nbytes,ssh_hashalg *halg,ptrlen data)

{
  size_t sVar1;
  uchar *puVar2;
  ssh_hash *h;
  ptrlen pVar3;
  
  sVar1 = rsa_pkcs1_length_of_fixed_parts(halg);
  if (sVar1 <= nbytes) {
    pVar3 = rsa_pkcs1_prefix_for_hash(halg);
    puVar2 = (uchar *)safemalloc(nbytes,1,0);
    puVar2[0] = '\0';
    puVar2[1] = '\x01';
    memset(puVar2 + 2,0xff,nbytes - sVar1);
    memcpy(puVar2 + (nbytes - sVar1) + 2,pVar3.ptr,pVar3.len);
    h = ssh_hash_new(halg);
    BinarySink_put_datapl(h->binarysink_,data);
    ssh_hash_final(h,puVar2 + (nbytes - sVar1) + 2 + pVar3.len);
    return puVar2;
  }
  __assert_fail("nbytes >= fixed_parts",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c",
                0x2d7,
                "unsigned char *rsa_pkcs1_signature_string(size_t, const ssh_hashalg *, ptrlen)");
}

Assistant:

static unsigned char *rsa_pkcs1_signature_string(
    size_t nbytes, const ssh_hashalg *halg, ptrlen data)
{
    size_t fixed_parts = rsa_pkcs1_length_of_fixed_parts(halg);
    assert(nbytes >= fixed_parts);
    size_t padding = nbytes - fixed_parts;

    ptrlen asn1_prefix = rsa_pkcs1_prefix_for_hash(halg);

    unsigned char *bytes = snewn(nbytes, unsigned char);

    bytes[0] = 0;
    bytes[1] = 1;

    memset(bytes + 2, 0xFF, padding);

    memcpy(bytes + 2 + padding, asn1_prefix.ptr, asn1_prefix.len);

    ssh_hash *h = ssh_hash_new(halg);
    put_datapl(h, data);
    ssh_hash_final(h, bytes + 2 + padding + asn1_prefix.len);

    return bytes;
}